

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *context)

{
  loc grid1;
  monster_conflict *mon;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  loc grid;
  char *dice_string;
  uint32_t uVar4;
  wchar_t v;
  _Bool _Var5;
  source origin;
  _Bool fear;
  wchar_t local_9c;
  monster_conflict *local_98;
  loc victim;
  char m_name [80];
  
  _Var5 = false;
  wVar2 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  uVar3 = Rand_div(8);
  fear = false;
  context->ident = true;
  _Var1 = target_set_closest(L'\x01',monster_is_living);
  if (_Var1) {
    local_9c = wVar2;
    target_get((loc_conflict *)&victim);
    local_98 = (monster_conflict *)target_get_monster();
    monster_desc(m_name,0x50,(monster *)local_98,L'\x15');
    uVar4 = uVar3 + 8;
    do {
      grid = (loc)loc_sum((loc_conflict)victim,(loc_conflict)ddgrid_ddd[(int)uVar3 % 8]);
      _Var1 = square_isplayertrap(cave,grid);
      if (((!_Var1) && (_Var1 = square_iswebbed(cave,grid), !_Var1)) &&
         (_Var1 = square_isopen(cave,grid), _Var1)) break;
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < (int)uVar4);
    if (uVar3 == uVar4) {
      _Var5 = false;
      msg("Not enough room next to %s!",m_name);
    }
    else {
      sound(10);
      grid1.x = (player->grid).x;
      grid1.y = (player->grid).y;
      monster_swap(grid1,grid);
      player_handle_post_move(player,true,false);
      mon = local_98;
      wVar2 = local_9c;
      v = local_98->hp + L'\x01';
      if (local_9c <= local_98->hp) {
        v = local_9c;
      }
      if (v < L'\x01') {
        __assert_fail("drain > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-attack.c"
                      ,0x8a8,"_Bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *)");
      }
      if ((player->opts).opt[3] == true) {
        msg("You bite %s. (%d)",m_name,(ulong)(uint)v);
      }
      else {
        msg("You bite %s.",m_name);
      }
      _Var1 = mon_take_hit(mon,player,wVar2,&fear," is drained dry!");
      dice_string = format("%d",(ulong)(uint)v);
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      effect_simple(L'\x03',origin,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      player_inc_timed(player,L'\n',v,false,false,false);
      if (_Var1) {
        target_set_location(L'\0',L'\0');
        _Var5 = true;
      }
      else {
        _Var1 = monster_is_visible((monster *)mon);
        _Var5 = true;
        if ((_Var1) && (message_pain(mon,wVar2), fear == true)) {
          add_monster_message(mon,L'%',true);
        }
      }
    }
  }
  return _Var5;
}

Assistant:

bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct loc victim, grid;
	int d, first_d = randint0(8);
	struct monster *mon = NULL;
	char m_name[80];
	int drain = 0;
	bool fear = false;
	bool dead = false;

	context->ident = true;

	/* Closest living monster */
	if (!target_set_closest(TARGET_KILL, monster_is_living)) {
		return false;
	}
	target_get(&victim);
	mon = target_get_monster();
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Look next to the monster */
	for (d = first_d; d < first_d + 8; d++) {
		grid = loc_sum(victim, ddgrid_ddd[d % 8]);
		if (square_isplayertrap(cave, grid)) continue;
		if (square_iswebbed(cave, grid)) continue;
		if (square_isopen(cave, grid)) break;
	}

	/* Needed to be adjacent */
	if (d == first_d + 8) {
		msg("Not enough room next to %s!", m_name);
		return false;
	}

	/* Sound */
	sound(MSG_TELEPORT);

	/* Move player */
	monster_swap(player->grid, grid);
	player_handle_post_move(player, true, false);

	/* Now bite it */
	drain = MIN(mon->hp + 1, amount);
	assert(drain > 0);
	if (OPT(player, show_damage)) {
		msg("You bite %s. (%d)", m_name, drain);
	} else {
		msg("You bite %s.", m_name);
	}
	dead = mon_take_hit(mon, player, amount, &fear, " is drained dry!");

	/* Heal and nourish */
	effect_simple(EF_HEAL_HP, context->origin, format("%d", drain), 0, 0, 0,
				  0, 0, NULL);
	player_inc_timed(player, TMD_FOOD, drain, false, false, false);

	if (dead) {
		/* Cancel the targeting of the dead creature. */
		target_set_location(0, 0);
	} else if (monster_is_visible(mon)) {
		/* Handle fear for surviving monsters */
		message_pain(mon, amount);
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}